

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

void map_iterator_next(map_iterator it)

{
  bucket pbVar1;
  pair p;
  bucket b;
  map_iterator it_local;
  
  if (it != (map_iterator)0x0) {
    while (it->current_bucket < it->m->capacity) {
      pbVar1 = it->m->buckets + it->current_bucket;
      if ((pbVar1->pairs != (pair)0x0) && (pbVar1->count != 0)) {
        while (it->current_pair < pbVar1->count) {
          if (pbVar1->pairs + it->current_pair != (pair)0x0) {
            it->current_pair = it->current_pair + 1;
            return;
          }
          it->current_pair = it->current_pair + 1;
        }
      }
      it->current_bucket = it->current_bucket + 1;
    }
  }
  return;
}

Assistant:

void map_iterator_next(map_iterator it)
{
	if (it != NULL)
	{
		for (; it->current_bucket < it->m->capacity; ++it->current_bucket)
		{
			bucket b = &it->m->buckets[it->current_bucket];

			if (b->pairs != NULL && b->count > 0)
			{
				for (; it->current_pair < b->count; ++it->current_pair)
				{
					pair p = &b->pairs[it->current_pair];

					if (p != NULL)
					{
						++it->current_pair;

						return;
					}
				}
			}
		}
	}
}